

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O3

int __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::subtree_ref::copy
          (subtree_ref *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  size_t sVar1;
  bt_impl<4096UL,_(bv::allocation_policy_t)0> *this_00;
  size_t sVar2;
  bt_impl_t *pbVar3;
  size_t sVar4;
  difference_type __node_offset_1;
  long lVar5;
  difference_type __node_offset;
  long lVar6;
  void *__src;
  _Elt_pointer pbVar7;
  
  (this->super_subtree_ref_base<false>)._rank = *(size_t *)(dst + 0x20);
  sVar1 = *(size_t *)(dst + 8);
  sVar2 = *(size_t *)(dst + 0x10);
  sVar4 = *(size_t *)(dst + 0x18);
  (this->super_subtree_ref_base<false>)._vector = *(bt_impl_t **)dst;
  (this->super_subtree_ref_base<false>)._index = sVar1;
  (this->super_subtree_ref_base<false>)._height = sVar2;
  (this->super_subtree_ref_base<false>)._size = sVar4;
  this_00 = *(bt_impl<4096UL,_(bv::allocation_policy_t)0> **)dst;
  if (*(long *)(dst + 0x10) == 0) {
    sVar1 = this_00->free_leaf;
    this_00->free_leaf = sVar1 + 1;
    std::
    deque<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
    ::resize(&this_00->leaves,sVar1 + 1);
    (this->super_subtree_ref_base<false>)._index = sVar1;
    lVar5 = *(long *)dst;
    lVar6 = (*(long *)(lVar5 + 0x1b0) - *(long *)(lVar5 + 0x1b8) >> 9) + *(long *)(dst + 8);
    if (lVar6 == 0) {
      __src = (void *)(*(long *)(lVar5 + 0x1b0) + *(long *)(dst + 8) * 0x200);
    }
    else {
      __src = *(void **)(*(long *)(lVar5 + 0x1c8) + lVar6 * 8);
    }
    pbVar3 = (this->super_subtree_ref_base<false>)._vector;
    pbVar7 = (pbVar3->leaves).
             super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    lVar5 = ((long)pbVar7 -
             (long)*(_Elt_pointer *)
                    ((long)&(pbVar3->leaves).
                            super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
                            ._M_impl.super__Deque_impl_data._M_start + 8) >> 9) + sVar1;
    if (lVar5 == 0) {
      pbVar7 = pbVar7 + sVar1;
    }
    else {
      pbVar7 = (*(_Map_pointer *)
                 ((long)&(pbVar3->leaves).
                         super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
                         ._M_impl.super__Deque_impl_data._M_start + 0x18))[lVar5];
    }
    memcpy(pbVar7,__src,0x200);
  }
  else {
    sVar2 = this_00->free_node;
    sVar1 = sVar2 + 1;
    this_00->free_node = sVar1;
    reserve_nodes(this_00,sVar1);
    (this->super_subtree_ref_base<false>)._index = sVar2;
    pbVar3 = (this->super_subtree_ref_base<false>)._vector;
    lVar5 = *(long *)dst;
    bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::copy
              (&(pbVar3->sizes)._bits,(EVP_PKEY_CTX *)(lVar5 + 0x68),
               (EVP_PKEY_CTX *)
               (*(long *)(dst + 8) * *(long *)(lVar5 + 0x20) * *(long *)(lVar5 + 0xc0)));
    lVar5 = *(long *)dst;
    bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::copy
              (&(pbVar3->ranks)._bits,(EVP_PKEY_CTX *)(lVar5 + 0xd0),
               (EVP_PKEY_CTX *)
               (*(long *)(dst + 8) * *(long *)(lVar5 + 0x20) * *(long *)(lVar5 + 0x128)));
    lVar5 = *(long *)dst;
    bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::copy
              (&(pbVar3->pointers)._bits,(EVP_PKEY_CTX *)(lVar5 + 0x138),
               (EVP_PKEY_CTX *)
               ((*(long *)(lVar5 + 0x20) + 1) * *(long *)(dst + 8) * *(long *)(lVar5 + 400)));
  }
  return (int)this;
}

Assistant:

subtree_ref copy() const
            {
                subtree_ref r = *this;
                if(is_node()) {
                    r._index = _vector.alloc_node();
                    
                    r.sizes()  = sizes();
                    r.ranks()    = ranks();
                    r.pointers() = pointers();
                } else {
                    r._index = _vector.alloc_leaf();
                    r.leaf() = leaf();
                }
                
                return r;
            }